

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O3

void __thiscall cnn::Device_CPU::~Device_CPU(Device_CPU *this)

{
  pointer pcVar1;
  
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__Device_CPU_00318ad8;
  MemAllocator::~MemAllocator(&(this->cpu_mem).super_MemAllocator);
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__Device_00318ab8;
  pcVar1 = (this->super_Device).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Device).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Device_CPU::~Device_CPU() {}